

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
  ::deserialize(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *__return_storage_ptr__,istream *in)

{
  bool bVar1;
  size_type __n;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,_std::allocator<double>_> *i;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  allocator<std::vector<double,_std::allocator<double>_>_> local_1e;
  undefined1 local_1d;
  int local_1c;
  istream *piStack_18;
  int size;
  istream *in_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *data;
  
  piStack_18 = in;
  in_local = (istream *)__return_storage_ptr__;
  local_1c = net_serializer<int,_void>::deserialize(in);
  local_1d = 0;
  __n = (size_type)local_1c;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_1e);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,__n,&local_1e);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_1e);
  __end0 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(__return_storage_ptr__);
  i = (vector<double,_std::allocator<double>_> *)
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::end(__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                     *)&i), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator*(&__end0);
    net_serializer<std::vector<double,_std::allocator<double>_>,_void>::deserialize
              (&local_68,piStack_18);
    std::vector<double,_std::allocator<double>_>::operator=(local_50,&local_68);
    std::vector<double,_std::allocator<double>_>::~vector(&local_68);
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> deserialize(std::istream& in){
        int size = net_serializer<int>::deserialize(in);
        std::vector<T> data(size);
        for (auto& i:data)
            i = net_serializer<T>::deserialize(in);
        return data;
    }